

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

Channel __thiscall cali::Caliper::get_channel(Caliper *this,cali_id_t id)

{
  bool bVar1;
  reference pCVar2;
  Channel *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Channel CVar4;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  local_48;
  Channel *local_40;
  Channel *local_38;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  local_30;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  local_28;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_> it
  ;
  cali_id_t id_local;
  Caliper *this_local;
  
  it._M_current = in_RDX;
  local_30._M_current =
       (Channel *)
       std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin
                 ((vector<cali::Channel,_std::allocator<cali::Channel>_> *)
                  (*(long *)(id + 8) + 0x8100));
  local_38 = (Channel *)
             std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end
                       ((vector<cali::Channel,_std::allocator<cali::Channel>_> *)
                        (*(long *)(id + 8) + 0x8100));
  local_40 = it._M_current;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<cali::Channel*,std::vector<cali::Channel,std::allocator<cali::Channel>>>,cali::Caliper::get_channel(unsigned_long)::__0>
                       (local_30,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                  )local_38,it._M_current);
  local_48._M_current =
       (Channel *)
       std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end
                 ((vector<cali::Channel,_std::allocator<cali::Channel>_> *)
                  (*(long *)(id + 8) + 0x8100));
  bVar1 = __gnu_cxx::operator==(&local_28,&local_48);
  if (bVar1) {
    Channel::Channel((Channel *)this);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pCVar2 = __gnu_cxx::
             __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
             ::operator*(&local_28);
    Channel::Channel((Channel *)this,pCVar2);
    _Var3._M_pi = extraout_RDX_00;
  }
  CVar4.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar4.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Channel)CVar4.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Channel Caliper::get_channel(cali_id_t id)
{
    auto it = std::find_if(sG->all_channels.begin(), sG->all_channels.end(), [id](const Channel& channel) {
        return id == channel.id();
    });

    return it == sG->all_channels.end() ? Channel() : *it;
}